

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<MyTestType,false,std::allocator<unsigned_long>>::coordinatesToOffset<unsigned_long*>
          (View<MyTestType,false,std::allocator<unsigned_long>> *this,unsigned_long *it,size_t *out)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong local_28;
  size_t j;
  size_t *out_local;
  unsigned_long *it_local;
  View<MyTestType,_false,_std::allocator<unsigned_long>_> *this_local;
  
  View<MyTestType,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this);
  *out = 0;
  local_28 = 0;
  out_local = it;
  while( true ) {
    sVar2 = View<MyTestType,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar2 <= local_28) break;
    uVar1 = *out_local;
    sVar2 = View<MyTestType,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this,local_28);
    marray_detail::Assert<bool>(uVar1 < sVar2);
    sVar2 = *out_local;
    sVar3 = View<MyTestType,_false,_std::allocator<unsigned_long>_>::strides
                      ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this,local_28);
    *out = sVar2 * sVar3 + *out;
    local_28 = local_28 + 1;
    out_local = out_local + 1;
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::coordinatesToOffset
(
    CoordinateIterator it,
    std::size_t& out
) const
{
    testInvariant();
    out = 0;
    for(std::size_t j=0; j<this->dimension(); ++j, ++it) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || static_cast<std::size_t>(*it) < shape(j));
        out += static_cast<std::size_t>(*it) * strides(j);
    }
}